

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_strip.c
# Opt level: O0

uint64_t TIFFVStripSize64(TIFF *tif,uint32_t nrows)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t local_58;
  uint local_50;
  uint local_4c;
  uint64_t samplingrow_size;
  uint64_t samplingrow_samples;
  uint32_t samplingblocks_ver;
  uint32_t samplingblocks_hor;
  uint16_t samplingblock_samples;
  TIFFDirectory *pTStack_28;
  uint16_t ycbcrsubsampling [2];
  TIFFDirectory *td;
  uint32_t nrows_local;
  TIFF *tif_local;
  
  pTStack_28 = &tif->tif_dir;
  td._4_4_ = nrows;
  if (nrows == 0xffffffff) {
    td._4_4_ = (tif->tif_dir).td_imagelength;
  }
  if ((((tif->tif_dir).td_planarconfig == 1) && ((tif->tif_dir).td_photometric == 6)) &&
     ((tif->tif_flags & 0x4000) == 0)) {
    if ((tif->tif_dir).td_samplesperpixel == 3) {
      TIFFGetFieldDefaulted(tif,0x212,&samplingblocks_hor,(long)&samplingblocks_hor + 2);
      if (((((ushort)samplingblocks_hor == 1) || ((ushort)samplingblocks_hor == 2)) ||
          ((ushort)samplingblocks_hor == 4)) &&
         (((samplingblocks_hor._2_2_ == 1 || (samplingblocks_hor._2_2_ == 2)) ||
          (samplingblocks_hor._2_2_ == 4)))) {
        if (pTStack_28->td_imagewidth < -((ushort)samplingblocks_hor - 1) - 1) {
          local_4c = (pTStack_28->td_imagewidth + ((ushort)samplingblocks_hor - 1)) /
                     (uint)(ushort)samplingblocks_hor;
        }
        else {
          local_4c = 0;
        }
        if (td._4_4_ < -(samplingblocks_hor._2_2_ - 1) - 1) {
          local_50 = (td._4_4_ + (samplingblocks_hor._2_2_ - 1)) / (uint)samplingblocks_hor._2_2_;
        }
        else {
          local_50 = 0;
        }
        uVar1 = _TIFFMultiply64(tif,(ulong)local_4c,
                                (ulong)(ushort)((ushort)samplingblocks_hor *
                                                samplingblocks_hor._2_2_ + 2),"TIFFVStripSize64");
        uVar2 = _TIFFMultiply64(tif,uVar1,(ulong)pTStack_28->td_bitspersample,"TIFFVStripSize64");
        if ((uVar2 & 7) == 0) {
          local_58 = _TIFFMultiply64(tif,uVar1,(ulong)pTStack_28->td_bitspersample,
                                     "TIFFVStripSize64");
          local_58 = local_58 >> 3;
        }
        else {
          uVar1 = _TIFFMultiply64(tif,uVar1,(ulong)pTStack_28->td_bitspersample,"TIFFVStripSize64");
          local_58 = (uVar1 >> 3) + 1;
        }
        tif_local = (TIFF *)_TIFFMultiply64(tif,local_58,(ulong)local_50,"TIFFVStripSize64");
      }
      else {
        TIFFErrorExtR(tif,"TIFFVStripSize64","Invalid YCbCr subsampling (%dx%d)",
                      (ulong)(ushort)samplingblocks_hor,(ulong)samplingblocks_hor._2_2_);
        tif_local = (TIFF *)0x0;
      }
    }
    else {
      TIFFErrorExtR(tif,"TIFFVStripSize64","Invalid td_samplesperpixel value");
      tif_local = (TIFF *)0x0;
    }
  }
  else {
    uVar1 = TIFFScanlineSize64(tif);
    tif_local = (TIFF *)_TIFFMultiply64(tif,(ulong)td._4_4_,uVar1,"TIFFVStripSize64");
  }
  return (uint64_t)tif_local;
}

Assistant:

uint64_t TIFFVStripSize64(TIFF *tif, uint32_t nrows)
{
    static const char module[] = "TIFFVStripSize64";
    TIFFDirectory *td = &tif->tif_dir;
    if (nrows == (uint32_t)(-1))
        nrows = td->td_imagelength;
    if ((td->td_planarconfig == PLANARCONFIG_CONTIG) &&
        (td->td_photometric == PHOTOMETRIC_YCBCR) && (!isUpSampled(tif)))
    {
        /*
         * Packed YCbCr data contain one Cb+Cr for every
         * HorizontalSampling*VerticalSampling Y values.
         * Must also roundup width and height when calculating
         * since images that are not a multiple of the
         * horizontal/vertical subsampling area include
         * YCbCr data for the extended image.
         */
        uint16_t ycbcrsubsampling[2];
        uint16_t samplingblock_samples;
        uint32_t samplingblocks_hor;
        uint32_t samplingblocks_ver;
        uint64_t samplingrow_samples;
        uint64_t samplingrow_size;
        if (td->td_samplesperpixel != 3)
        {
            TIFFErrorExtR(tif, module, "Invalid td_samplesperpixel value");
            return 0;
        }
        TIFFGetFieldDefaulted(tif, TIFFTAG_YCBCRSUBSAMPLING,
                              ycbcrsubsampling + 0, ycbcrsubsampling + 1);
        if ((ycbcrsubsampling[0] != 1 && ycbcrsubsampling[0] != 2 &&
             ycbcrsubsampling[0] != 4) ||
            (ycbcrsubsampling[1] != 1 && ycbcrsubsampling[1] != 2 &&
             ycbcrsubsampling[1] != 4))
        {
            TIFFErrorExtR(tif, module, "Invalid YCbCr subsampling (%dx%d)",
                          ycbcrsubsampling[0], ycbcrsubsampling[1]);
            return 0;
        }
        samplingblock_samples = ycbcrsubsampling[0] * ycbcrsubsampling[1] + 2;
        samplingblocks_hor =
            TIFFhowmany_32(td->td_imagewidth, ycbcrsubsampling[0]);
        samplingblocks_ver = TIFFhowmany_32(nrows, ycbcrsubsampling[1]);
        samplingrow_samples = _TIFFMultiply64(tif, samplingblocks_hor,
                                              samplingblock_samples, module);
        samplingrow_size = TIFFhowmany8_64(_TIFFMultiply64(
            tif, samplingrow_samples, td->td_bitspersample, module));
        return (
            _TIFFMultiply64(tif, samplingrow_size, samplingblocks_ver, module));
    }
    else
        return (_TIFFMultiply64(tif, nrows, TIFFScanlineSize64(tif), module));
}